

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

void __thiscall QDateTime::setOffsetFromUtc(QDateTime *this,int offsetSeconds)

{
  long in_FS_OFFSET;
  QTimeZone *unaff_retaddr;
  QDateTimeData *in_stack_00000008;
  int in_stack_ffffffffffffffdc;
  long lVar1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QTimeZone::fromSecondsAheadOfUtc(in_stack_ffffffffffffffdc);
  reviseTimeZone(in_stack_00000008,unaff_retaddr,(TransitionResolution)((ulong)lVar1 >> 0x20));
  QTimeZone::~QTimeZone((QTimeZone *)0x56fa89);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTime::setOffsetFromUtc(int offsetSeconds)
{
    reviseTimeZone(d, QTimeZone::fromSecondsAheadOfUtc(offsetSeconds),
                   TransitionResolution::Reject);
}